

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asdcp-test.cpp
# Opt level: O2

void __thiscall CommandOptions::CommandOptions(CommandOptions *this,int argc,char **argv)

{
  char cVar1;
  uint uVar2;
  MajorMode_t MVar3;
  int iVar4;
  ChannelFormat_t CVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  char *pcVar10;
  char *__format;
  int iVar11;
  undefined8 uStack_90;
  allocator<char> local_79;
  ui32_t *local_78;
  byte_t *local_70;
  byte_t *local_68;
  byte_t *local_60;
  ui32_t *local_58;
  ui32_t length;
  
  this->mode = MMT_NONE;
  this->error_flag = true;
  this->key_flag = false;
  this->key_id_flag = false;
  this->asset_id_flag = false;
  this->encrypt_header_flag = true;
  this->write_hmac = true;
  this->read_hmac = false;
  this->split_wav = false;
  this->mono_wav = false;
  this->verbose_flag = false;
  local_58 = &this->fb_dump_size;
  this->fb_dump_size = 0;
  this->showindex_flag = false;
  this->showheader_flag = false;
  this->no_write_flag = false;
  this->version_flag = false;
  this->help_flag = false;
  this->stereo_image_flag = false;
  this->number_width = 6;
  this->start_frame = 0;
  this->duration = 0xffffffff;
  this->duration_flag = false;
  this->do_repeat = false;
  this->use_smpte_labels = false;
  this->j2c_pedantic = true;
  this->picture_rate = 0x18;
  this->fb_size = 0x400000;
  local_78 = &this->file_count;
  this->channel_fmt = CF_NONE;
  local_60 = this->key_value;
  local_68 = this->key_id_value;
  local_70 = this->asset_id_value;
  *(undefined8 *)&this->file_count = 0;
  *(undefined8 *)((long)&this->file_root + 4) = 0;
  *(undefined8 *)((long)&this->out_file + 4) = 0;
  this->key_value[4] = '\0';
  this->key_value[5] = '\0';
  this->key_value[6] = '\0';
  this->key_value[7] = '\0';
  this->key_value[8] = '\0';
  this->key_value[9] = '\0';
  this->key_value[10] = '\0';
  this->key_value[0xb] = '\0';
  this->key_id_value[0xc] = '\0';
  this->key_id_value[0xd] = '\0';
  this->key_id_value[0xe] = '\0';
  this->key_id_value[0xf] = '\0';
  *(undefined8 *)(this->key_value + 0xc) = 0;
  this->key_id_value[4] = '\0';
  this->key_id_value[5] = '\0';
  this->key_id_value[6] = '\0';
  this->key_id_value[7] = '\0';
  this->key_id_value[8] = '\0';
  this->key_id_value[9] = '\0';
  this->key_id_value[10] = '\0';
  this->key_id_value[0xb] = '\0';
  for (iVar11 = 1; iVar11 < argc; iVar11 = iVar11 + 1) {
    pcVar10 = argv[iVar11];
    iVar4 = strcmp(pcVar10,"-help");
    if (iVar4 == 0) {
      this->help_flag = true;
      goto LAB_00111ccc;
    }
    if (*pcVar10 != '-') {
      uVar2 = this->file_count;
      uVar7 = uVar2 + 1;
      this->file_count = uVar7;
      this->filenames[uVar2] = pcVar10;
      if (0xf < uVar7) {
        pcVar10 = "Filename lists exceeds maximum list size: %u\n";
        uStack_90 = 0x10;
        goto LAB_00111deb;
      }
      goto LAB_00111ccc;
    }
    cVar1 = pcVar10[1];
    iVar4 = isalpha((int)cVar1);
    if ((9 < (int)cVar1 - 0x30U && iVar4 == 0) || (pcVar10[2] != '\0')) {
      __format = "Unrecognized argument: %s\n";
LAB_00111db5:
      fprintf(_stderr,__format,pcVar10);
      return;
    }
    switch(cVar1) {
    case '1':
      this->mono_wav = true;
      break;
    case '2':
    case 'S':
      this->split_wav = true;
      break;
    case '3':
      this->stereo_image_flag = true;
      break;
    default:
      __format = "Unrecognized option: %s\n";
      goto LAB_00111db5;
    case 'E':
      this->encrypt_header_flag = false;
      break;
    case 'G':
      this->mode = MMT_GOP_START;
      break;
    case 'H':
      this->showheader_flag = true;
      break;
    case 'L':
      this->use_smpte_labels = true;
      break;
    case 'M':
      this->write_hmac = false;
      break;
    case 'R':
      this->do_repeat = true;
      break;
    case 'U':
      this->mode = MMT_UL_LIST;
      break;
    case 'V':
      this->version_flag = true;
      break;
    case 'W':
      this->no_write_flag = true;
      break;
    case 'Z':
      this->j2c_pedantic = false;
      break;
    case 'a':
      this->asset_id_flag = true;
      if ((argc <= iVar11 + 1) || (*argv[iVar11 + 1] == '-')) {
        pcVar10 = "Argument not found for option -%c.\n";
        uStack_90 = 0x61;
LAB_00111deb:
        fprintf(_stderr,pcVar10,uStack_90);
        return;
      }
      Kumu::hex2bin(argv[iVar11 + 1],local_70,0x10,&length);
      uVar9 = (ulong)length;
      if (length != 0x10) {
        pcVar10 = "Unexpected asset ID length: %u, expecting %u characters.\n";
LAB_00111f6e:
        fprintf(_stderr,pcVar10,uVar9,0x10);
        return;
      }
      goto LAB_00111d61;
    case 'b':
      iVar11 = iVar11 + 1;
      if ((argc <= iVar11) || (*argv[iVar11] == '-')) {
        pcVar10 = "Argument not found for option -%c.\n";
        uStack_90 = 0x62;
        goto LAB_00111deb;
      }
      lVar6 = strtol(argv[iVar11],(char **)0x0,10);
      lVar8 = -lVar6;
      if (0 < lVar6) {
        lVar8 = lVar6;
      }
      this->fb_size = (ui32_t)lVar8;
      if (this->verbose_flag == true) {
        fprintf(_stderr,"Frame Buffer size: %u bytes.\n");
      }
      break;
    case 'c':
      iVar11 = iVar11 + 1;
      if ((argc <= iVar11) || (pcVar10 = argv[iVar11], *pcVar10 == '-')) {
        pcVar10 = "Argument not found for option -%c.\n";
        uStack_90 = 99;
        goto LAB_00111deb;
      }
      this->mode = MMT_CREATE;
      this->out_file = pcVar10;
      break;
    case 'd':
      iVar11 = iVar11 + 1;
      if ((argc <= iVar11) || (pcVar10 = argv[iVar11], *pcVar10 == '-')) {
        pcVar10 = "Argument not found for option -%c.\n";
        uStack_90 = 100;
        goto LAB_00111deb;
      }
      this->duration_flag = true;
      lVar6 = strtol(pcVar10,(char **)0x0,10);
      lVar8 = -lVar6;
      if (0 < lVar6) {
        lVar8 = lVar6;
      }
      this->duration = (ui32_t)lVar8;
      break;
    case 'e':
      this->encrypt_header_flag = true;
      break;
    case 'f':
      iVar11 = iVar11 + 1;
      if ((argc <= iVar11) || (*argv[iVar11] == '-')) {
        pcVar10 = "Argument not found for option -%c.\n";
        uStack_90 = 0x66;
        goto LAB_00111deb;
      }
      lVar6 = strtol(argv[iVar11],(char **)0x0,10);
      lVar8 = -lVar6;
      if (0 < lVar6) {
        lVar8 = lVar6;
      }
      this->start_frame = (ui32_t)lVar8;
      break;
    case 'g':
      this->mode = MMT_GEN_KEY;
      break;
    case 'h':
      this->help_flag = true;
      break;
    case 'i':
      this->mode = MMT_INFO;
      break;
    case 'j':
      this->key_id_flag = true;
      if ((argc <= iVar11 + 1) || (*argv[iVar11 + 1] == '-')) {
        pcVar10 = "Argument not found for option -%c.\n";
        uStack_90 = 0x6a;
        goto LAB_00111deb;
      }
      Kumu::hex2bin(argv[iVar11 + 1],local_68,0x10,&length);
      uVar9 = (ulong)length;
      if (length != 0x10) {
        pcVar10 = "Unexpected key ID length: %u, expecting %u characters.\n";
        goto LAB_00111f6e;
      }
      goto LAB_00111d61;
    case 'k':
      this->key_flag = true;
      if ((argc <= iVar11 + 1) || (*argv[iVar11 + 1] == '-')) {
        pcVar10 = "Argument not found for option -%c.\n";
        uStack_90 = 0x6b;
        goto LAB_00111deb;
      }
      Kumu::hex2bin(argv[iVar11 + 1],local_60,0x10,&length);
      uVar9 = (ulong)length;
      if (length != 0x10) {
        pcVar10 = "Unexpected key length: %u, expecting %u characters.\n";
        goto LAB_00111f6e;
      }
      goto LAB_00111d61;
    case 'l':
      iVar11 = iVar11 + 1;
      if ((argc <= iVar11) || (*argv[iVar11] == '-')) {
        pcVar10 = "Argument not found for option -%c.\n";
        uStack_90 = 0x6c;
        goto LAB_00111deb;
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&length,argv[iVar11],&local_79);
      CVar5 = decode_channel_fmt((string *)&length);
      this->channel_fmt = CVar5;
      std::__cxx11::string::~string((string *)&length);
      break;
    case 'm':
      this->read_hmac = true;
      break;
    case 'n':
      this->showindex_flag = true;
      break;
    case 'p':
      iVar11 = iVar11 + 1;
      if ((argc <= iVar11) || (*argv[iVar11] == '-')) {
        pcVar10 = "Argument not found for option -%c.\n";
        uStack_90 = 0x70;
        goto LAB_00111deb;
      }
      lVar6 = strtol(argv[iVar11],(char **)0x0,10);
      lVar8 = -lVar6;
      if (0 < lVar6) {
        lVar8 = lVar6;
      }
      this->picture_rate = (ui32_t)lVar8;
      break;
    case 's':
      if ((argc <= iVar11 + 1) || (*argv[iVar11 + 1] == '-')) {
        pcVar10 = "Argument not found for option -%c.\n";
        uStack_90 = 0x73;
        goto LAB_00111deb;
      }
      lVar6 = strtol(argv[iVar11 + 1],(char **)0x0,10);
      lVar8 = -lVar6;
      if (0 < lVar6) {
        lVar8 = lVar6;
      }
      *local_58 = (ui32_t)lVar8;
LAB_00111d61:
      iVar11 = iVar11 + 1;
      break;
    case 't':
      this->mode = MMT_DIGEST;
      break;
    case 'u':
      this->mode = MMT_GEN_ID;
      break;
    case 'v':
      this->verbose_flag = true;
      break;
    case 'w':
      iVar11 = iVar11 + 1;
      if ((argc <= iVar11) || (*argv[iVar11] == '-')) {
        pcVar10 = "Argument not found for option -%c.\n";
        uStack_90 = 0x77;
        goto LAB_00111deb;
      }
      lVar6 = strtol(argv[iVar11],(char **)0x0,10);
      lVar8 = -lVar6;
      if (0 < lVar6) {
        lVar8 = lVar6;
      }
      this->number_width = (ui32_t)lVar8;
      break;
    case 'x':
      iVar11 = iVar11 + 1;
      if ((argc <= iVar11) || (pcVar10 = argv[iVar11], *pcVar10 == '-')) {
        pcVar10 = "Argument not found for option -%c.\n";
        uStack_90 = 0x78;
        goto LAB_00111deb;
      }
      this->mode = MMT_EXTRACT;
      this->file_root = pcVar10;
      break;
    case 'z':
      this->j2c_pedantic = true;
    }
LAB_00111ccc:
  }
  if (this->help_flag != false) {
    return;
  }
  if (this->version_flag != false) {
    return;
  }
  MVar3 = this->mode;
  if (MVar3 < MMT_UL_LIST) {
    if ((0xceU >> (MVar3 & 0x1f) & 1) == 0) {
      if (MVar3 == MMT_NONE) {
        pcVar10 = "No operation selected (use one of -[gGcitux] or -h for help).\n";
        goto LAB_00111e06;
      }
    }
    else if (*local_78 == 0) {
      pcVar10 = "Option requires at least one filename argument.\n";
LAB_00111e06:
      fputs(pcVar10,_stderr);
      return;
    }
  }
  this->error_flag = false;
  return;
}

Assistant:

CommandOptions(int argc, const char** argv) :
    mode(MMT_NONE), error_flag(true), key_flag(false), key_id_flag(false), asset_id_flag(false),
    encrypt_header_flag(true), write_hmac(true), read_hmac(false), split_wav(false), mono_wav(false),
    verbose_flag(false), fb_dump_size(0), showindex_flag(false), showheader_flag(false),
    no_write_flag(false), version_flag(false), help_flag(false), stereo_image_flag(false),
    number_width(6), start_frame(0),
    duration(0xffffffff), duration_flag(false), do_repeat(false), use_smpte_labels(false), j2c_pedantic(true),
    picture_rate(24), fb_size(FRAME_BUFFER_SIZE), file_count(0), file_root(0), out_file(0),
    channel_fmt(PCM::CF_NONE)
  {
    memset(key_value, 0, KeyLen);
    memset(key_id_value, 0, UUIDlen);

    for ( int i = 1; i < argc; i++ )
      {

	if ( (strcmp( argv[i], "-help") == 0) )
	  {
	    help_flag = true;
	    continue;
	  }
         
	if ( argv[i][0] == '-'
	     && ( isalpha(argv[i][1]) || isdigit(argv[i][1]) )
	     && argv[i][2] == 0 )
	  {
	    switch ( argv[i][1] )
	      {
	      case '1': mono_wav = true; break;
	      case '2': split_wav = true; break;
	      case '3': stereo_image_flag = true; break;

	      case 'a':
		asset_id_flag = true;
		TEST_EXTRA_ARG(i, 'a');
		{
		  ui32_t length;
		  Kumu::hex2bin(argv[i], asset_id_value, UUIDlen, &length);

		  if ( length != UUIDlen )
		    {
		      fprintf(stderr, "Unexpected asset ID length: %u, expecting %u characters.\n", length, UUIDlen);
		      return;
		    }
		}
		break;

	      case 'b':
		TEST_EXTRA_ARG(i, 'b');
		fb_size = Kumu::xabs(strtol(argv[i], 0, 10));

		if ( verbose_flag )
		  fprintf(stderr, "Frame Buffer size: %u bytes.\n", fb_size);

		break;

	      case 'c':
		TEST_EXTRA_ARG(i, 'c');
		mode = MMT_CREATE;
		out_file = argv[i];
		break;

	      case 'd':
		TEST_EXTRA_ARG(i, 'd');
		duration_flag = true;
		duration = Kumu::xabs(strtol(argv[i], 0, 10));
		break;

	      case 'E': encrypt_header_flag = false; break;
	      case 'e': encrypt_header_flag = true; break;

	      case 'f':
		TEST_EXTRA_ARG(i, 'f');
		start_frame = Kumu::xabs(strtol(argv[i], 0, 10));
		break;

	      case 'G': mode = MMT_GOP_START; break;
	      case 'g': mode = MMT_GEN_KEY; break;
	      case 'H': showheader_flag = true; break;
	      case 'h': help_flag = true; break;
	      case 'i': mode = MMT_INFO;	break;

	      case 'j': key_id_flag = true;
		TEST_EXTRA_ARG(i, 'j');
		{
		  ui32_t length;
		  Kumu::hex2bin(argv[i], key_id_value, UUIDlen, &length);

		  if ( length != UUIDlen )
		    {
		      fprintf(stderr, "Unexpected key ID length: %u, expecting %u characters.\n", length, UUIDlen);
		      return;
		    }
		}
		break;

	      case 'k': key_flag = true;
		TEST_EXTRA_ARG(i, 'k');
		{
		  ui32_t length;
		  Kumu::hex2bin(argv[i], key_value, KeyLen, &length);

		  if ( length != KeyLen )
		    {
		      fprintf(stderr, "Unexpected key length: %u, expecting %u characters.\n", length, KeyLen);
		      return;
		    }
		}
		break;

	      case 'l':
		TEST_EXTRA_ARG(i, 'l');
		channel_fmt = decode_channel_fmt(argv[i]);
		break;

	      case 'L': use_smpte_labels = true; break;
	      case 'M': write_hmac = false; break;
	      case 'm': read_hmac = true; break;
	      case 'n': showindex_flag = true; break;

	      case 'p':
		TEST_EXTRA_ARG(i, 'p');
		picture_rate = Kumu::xabs(strtol(argv[i], 0, 10));
		break;

	      case 'R': do_repeat = true; break;
	      case 'S': split_wav = true; break;

	      case 's':
		TEST_EXTRA_ARG(i, 's');
		fb_dump_size = Kumu::xabs(strtol(argv[i], 0, 10));
		break;

	      case 't': mode = MMT_DIGEST; break;
	      case 'U':	mode = MMT_UL_LIST; break;
	      case 'u':	mode = MMT_GEN_ID; break;
	      case 'V': version_flag = true; break;
	      case 'v': verbose_flag = true; break;
	      case 'W': no_write_flag = true; break;

	      case 'w':
		TEST_EXTRA_ARG(i, 'w');
		number_width = Kumu::xabs(strtol(argv[i], 0, 10));
		break;

	      case 'x':
		TEST_EXTRA_ARG(i, 'x');
		mode = MMT_EXTRACT;
		file_root = argv[i];
		break;

	      case 'Z': j2c_pedantic = false; break;
	      case 'z': j2c_pedantic = true; break;

	      default:
		fprintf(stderr, "Unrecognized option: %s\n", argv[i]);
		return;
	      }
	  }
	else
	  {

	    if ( argv[i][0] != '-' )
	      {
		filenames[file_count++] = argv[i];
	      }
	    else
	      {
		fprintf(stderr, "Unrecognized argument: %s\n", argv[i]);
		return;
	      }

	    if ( file_count >= MAX_IN_FILES )
	      {
		fprintf(stderr, "Filename lists exceeds maximum list size: %u\n", MAX_IN_FILES);
		return;
	      }
	  }
      }

    if ( help_flag || version_flag )
      return;
    
    if ( ( mode == MMT_INFO
	   || mode == MMT_CREATE
	   || mode == MMT_EXTRACT
	   || mode == MMT_GOP_START
	   || mode == MMT_DIGEST ) && file_count == 0 )
      {
	fputs("Option requires at least one filename argument.\n", stderr);
	return;
      }

    if ( mode == MMT_NONE && ! help_flag && ! version_flag )
      {
	fputs("No operation selected (use one of -[gGcitux] or -h for help).\n", stderr);
	return;
      }

    error_flag = false;
  }